

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O0

void oggpack_readinit(oggpack_buffer *b,ogg_reference *r)

{
  ogg_reference *r_local;
  oggpack_buffer *b_local;
  
  memset(b,0,0x30);
  b->head = r;
  b->tail = r;
  b->count = 0;
  b->headptr = b->head->buffer->data + b->head->begin;
  b->headend = b->head->length;
  _span(b);
  return;
}

Assistant:

void oggpack_readinit(oggpack_buffer *b,ogg_reference *r){
  memset(b,0,sizeof(*b));

  b->tail=b->head=r;
  b->count=0;
  b->headptr=b->head->buffer->data+b->head->begin;
  b->headend=b->head->length;
  _span(b);
}